

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

void vkt::wsi::anon_unknown_0::initFramebuffers
               (DeviceInterface *vkd,VkDevice device,VkRenderPass renderPass,
               vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               *imageViews,deUint32 width,deUint32 height,
               vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
               *framebuffers)

{
  ulong uVar1;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  *device_00;
  VkDevice vkd_00;
  DeviceInterface *renderPass_00;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  Move<vk::Handle<(vk::HandleType)23>_> local_60;
  deUint64 local_40;
  ulong local_38;
  size_t ndx;
  deUint32 height_local;
  deUint32 width_local;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  *imageViews_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  VkRenderPass renderPass_local;
  
  local_38 = 0;
  ndx._0_4_ = height;
  ndx._4_4_ = width;
  _height_local = imageViews;
  imageViews_local =
       (vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *)
       device;
  device_local = (VkDevice)vkd;
  vkd_local = (DeviceInterface *)renderPass.m_internal;
  while( true ) {
    uVar1 = local_38;
    sVar2 = std::
            vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
            ::size(framebuffers);
    renderPass_00 = vkd_local;
    vkd_00 = device_local;
    device_00 = imageViews_local;
    if (sVar2 <= uVar1) break;
    pvVar3 = std::
             vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ::operator[](imageViews,local_38);
    createFramebuffer(&local_60,(DeviceInterface *)vkd_00,(VkDevice)device_00,
                      (VkRenderPass)renderPass_00,(VkImageView)pvVar3->m_internal,ndx._4_4_,
                      (deUint32)ndx);
    local_40 = (deUint64)::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::disown(&local_60);
    pvVar4 = std::
             vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
             ::operator[](framebuffers,local_38);
    pvVar4->m_internal = local_40;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_60);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void initFramebuffers (const vk::DeviceInterface&		vkd,
					   vk::VkDevice						device,
					   vk::VkRenderPass					renderPass,
					   std::vector<vk::VkImageView>		imageViews,
					   deUint32							width,
					   deUint32							height,
					   std::vector<vk::VkFramebuffer>&	framebuffers)
{
	DE_ASSERT(framebuffers.size() == imageViews.size());

	for (size_t ndx = 0; ndx < framebuffers.size(); ndx++)
		framebuffers[ndx] = createFramebuffer(vkd, device, renderPass, imageViews[ndx], width, height).disown();
}